

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::save_load_online_state(vw *all,io_buf *model_file,bool read,bool text,gd *g)

{
  uint64_t *data;
  bool bVar1;
  ostream *poVar2;
  float dump_interval;
  gd *local_1d8;
  double total_weight;
  double local_1c8;
  size_t temp_pass;
  stringstream msg;
  ostream local_1a8;
  
  local_1d8 = g;
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar2 = std::operator<<(&local_1a8,"initial_t ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,all->initial_t);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&all->initial_t,4,"",read,&msg,text);
  std::operator<<(&local_1a8,"norm normalizer ");
  poVar2 = std::ostream::_M_insert<double>(all->normalized_sum_norm_x);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&all->normalized_sum_norm_x,8,"",read,&msg,text);
  std::operator<<(&local_1a8,"t ");
  poVar2 = std::ostream::_M_insert<double>(all->sd->t);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&all->sd->t,8,"",read,&msg,text);
  std::operator<<(&local_1a8,"sum_loss ");
  poVar2 = std::ostream::_M_insert<double>(all->sd->sum_loss);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&all->sd->sum_loss,8,"",read,&msg,text);
  std::operator<<(&local_1a8,"sum_loss_since_last_dump ");
  poVar2 = std::ostream::_M_insert<double>(all->sd->sum_loss_since_last_dump);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed
            (model_file,(char *)&all->sd->sum_loss_since_last_dump,8,"",read,&msg,text);
  dump_interval = all->sd->dump_interval;
  poVar2 = std::operator<<(&local_1a8,"dump_interval ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dump_interval);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&dump_interval,4,"",read,&msg,text);
  if ((!read) || ((all->training == true && (all->preserve_performance_counters == true)))) {
    all->sd->dump_interval = dump_interval;
  }
  poVar2 = std::operator<<(&local_1a8,"min_label ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,all->sd->min_label);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&all->sd->min_label,4,"",read,&msg,text);
  poVar2 = std::operator<<(&local_1a8,"max_label ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,all->sd->max_label);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&all->sd->max_label,4,"",read,&msg,text);
  std::operator<<(&local_1a8,"weighted_labeled_examples ");
  poVar2 = std::ostream::_M_insert<double>(all->sd->weighted_labeled_examples);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed
            (model_file,(char *)&all->sd->weighted_labeled_examples,8,"",read,&msg,text);
  std::operator<<(&local_1a8,"weighted_labels ");
  poVar2 = std::ostream::_M_insert<double>(all->sd->weighted_labels);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&all->sd->weighted_labels,8,"",read,&msg,text);
  std::operator<<(&local_1a8,"weighted_unlabeled_examples ");
  poVar2 = std::ostream::_M_insert<double>(all->sd->weighted_unlabeled_examples);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed
            (model_file,(char *)&all->sd->weighted_unlabeled_examples,8,"",read,&msg,text);
  poVar2 = std::operator<<(&local_1a8,"example_number ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&all->sd->example_number,8,"",read,&msg,text);
  poVar2 = std::operator<<(&local_1a8,"total_features ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  bin_text_read_write_fixed(model_file,(char *)&all->sd->total_features,8,"",read,&msg,text);
  if (read) {
    bVar1 = version_struct::operator>=(&all->model_file_ver,"7.10.1");
    if (bVar1) goto LAB_00131eb5;
  }
  else {
LAB_00131eb5:
    local_1c8 = 0.0;
    if (local_1d8 != (gd *)0x0 && !read) {
      local_1c8 = local_1d8->total_weight;
    }
    total_weight = local_1c8;
    std::operator<<(&local_1a8,"gd::total_weight ");
    poVar2 = std::ostream::_M_insert<double>(local_1c8);
    std::operator<<(poVar2,"\n");
    bin_text_read_write_fixed(model_file,(char *)&total_weight,8,"",read,&msg,text);
    if (read && local_1d8 != (gd *)0x0) {
      local_1d8->total_weight = total_weight;
    }
    std::operator<<(&local_1a8,"sd::oec.weighted_labeled_examples ");
    poVar2 = std::ostream::_M_insert<double>(all->sd->old_weighted_labeled_examples);
    std::operator<<(poVar2,"\n");
    bin_text_read_write_fixed
              (model_file,(char *)&all->sd->old_weighted_labeled_examples,8,"",read,&msg,text);
    poVar2 = std::operator<<(&local_1a8,"current_pass ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    bVar1 = version_struct::operator>=(&all->model_file_ver,"8.3.3");
    data = &all->current_pass;
    if (bVar1) {
      bin_text_read_write_fixed(model_file,(char *)data,8,"",read,&msg,text);
    }
    else {
      temp_pass = *data;
      bin_text_read_write_fixed(model_file,(char *)&temp_pass,8,"",read,&msg,text);
      *data = temp_pass;
    }
    if (!read) goto LAB_0013209e;
  }
  if ((all->training != true) || (all->preserve_performance_counters == false)) {
    all->sd->sum_loss = 0.0;
    all->sd->sum_loss_since_last_dump = 0.0;
    all->sd->weighted_labeled_examples = 0.0;
    all->sd->weighted_labels = 0.0;
    all->sd->weighted_unlabeled_examples = 0.0;
    all->sd->old_weighted_labeled_examples = 0.0;
    all->sd->example_number = 0;
    all->sd->total_features = 0;
    all->current_pass = 0;
  }
LAB_0013209e:
  if ((all->weights).sparse == true) {
    save_load_online_state<sparse_parameters>
              (all,model_file,read,text,local_1d8,&msg,&(all->weights).sparse_weights);
  }
  else {
    save_load_online_state<dense_parameters>
              (all,model_file,read,text,local_1d8,&msg,&(all->weights).dense_weights);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g)
{
  // vw& all = *g.all;
  stringstream msg;

  msg << "initial_t " << all.initial_t << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.initial_t, sizeof(all.initial_t), "", read, msg, text);

  msg << "norm normalizer " << all.normalized_sum_norm_x << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.normalized_sum_norm_x, sizeof(all.normalized_sum_norm_x), "", read, msg, text);

  msg << "t " << all.sd->t << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->t, sizeof(all.sd->t), "", read, msg, text);

  msg << "sum_loss " << all.sd->sum_loss << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->sum_loss, sizeof(all.sd->sum_loss), "", read, msg, text);

  msg << "sum_loss_since_last_dump " << all.sd->sum_loss_since_last_dump << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->sum_loss_since_last_dump,
      sizeof(all.sd->sum_loss_since_last_dump), "", read, msg, text);

  float dump_interval = all.sd->dump_interval;
  msg << "dump_interval " << dump_interval << "\n";
  bin_text_read_write_fixed(model_file, (char*)&dump_interval, sizeof(dump_interval), "", read, msg, text);
  if (!read || (all.training && all.preserve_performance_counters))  // update dump_interval from input model
    all.sd->dump_interval = dump_interval;

  msg << "min_label " << all.sd->min_label << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->min_label, sizeof(all.sd->min_label), "", read, msg, text);

  msg << "max_label " << all.sd->max_label << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->max_label, sizeof(all.sd->max_label), "", read, msg, text);

  msg << "weighted_labeled_examples " << all.sd->weighted_labeled_examples << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->weighted_labeled_examples,
      sizeof(all.sd->weighted_labeled_examples), "", read, msg, text);

  msg << "weighted_labels " << all.sd->weighted_labels << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.sd->weighted_labels, sizeof(all.sd->weighted_labels), "", read, msg, text);

  msg << "weighted_unlabeled_examples " << all.sd->weighted_unlabeled_examples << "\n";
  bin_text_read_write_fixed(model_file, (char*)&all.sd->weighted_unlabeled_examples,
      sizeof(all.sd->weighted_unlabeled_examples), "", read, msg, text);

  msg << "example_number " << all.sd->example_number << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.sd->example_number, sizeof(all.sd->example_number), "", read, msg, text);

  msg << "total_features " << all.sd->total_features << "\n";
  bin_text_read_write_fixed(
      model_file, (char*)&all.sd->total_features, sizeof(all.sd->total_features), "", read, msg, text);

  if (!read || all.model_file_ver >= VERSION_SAVE_RESUME_FIX)
  {
    // restore some data to allow --save_resume work more accurate

    // fix average loss
    double total_weight = 0.;  // value holder as g* may be null
    if (!read && g != nullptr)
      total_weight = g->total_weight;
    msg << "gd::total_weight " << total_weight << "\n";
    bin_text_read_write_fixed(model_file, (char*)&total_weight, sizeof(total_weight), "", read, msg, text);
    if (read && g != nullptr)
      g->total_weight = total_weight;

    // fix "loss since last" for first printed out example details
    msg << "sd::oec.weighted_labeled_examples " << all.sd->old_weighted_labeled_examples << "\n";
    bin_text_read_write_fixed(model_file, (char*)&all.sd->old_weighted_labeled_examples,
        sizeof(all.sd->old_weighted_labeled_examples), "", read, msg, text);

    // fix "number of examples per pass"
    msg << "current_pass " << all.current_pass << "\n";
    if (all.model_file_ver >= VERSION_PASS_UINT64)
      bin_text_read_write_fixed(model_file, (char*)&all.current_pass, sizeof(all.current_pass), "", read, msg, text);
    else  // backwards compatiblity.
    {
      size_t temp_pass = (size_t)all.current_pass;
      bin_text_read_write_fixed(model_file, (char*)&temp_pass, sizeof(temp_pass), "", read, msg, text);
      all.current_pass = temp_pass;
    }
  }

  if (read &&
      (!all.training ||
          !all.preserve_performance_counters))  // reset various things so that we report test set performance properly
  {
    all.sd->sum_loss = 0;
    all.sd->sum_loss_since_last_dump = 0;
    all.sd->weighted_labeled_examples = 0.;
    all.sd->weighted_labels = 0.;
    all.sd->weighted_unlabeled_examples = 0.;
    all.sd->old_weighted_labeled_examples = 0.;
    all.sd->example_number = 0;
    all.sd->total_features = 0;
    all.current_pass = 0;
  }
  if (all.weights.sparse)
    save_load_online_state(all, model_file, read, text, g, msg, all.weights.sparse_weights);
  else
    save_load_online_state(all, model_file, read, text, g, msg, all.weights.dense_weights);
}